

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

bool __thiscall
google::protobuf::Reflection::IsSingularFieldNonEmpty
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  byte bVar1;
  bool bVar2;
  CppStringType CVar3;
  float *pfVar4;
  bool *pbVar5;
  double *pdVar6;
  Cord *pCVar7;
  InlinedStringField *pIVar8;
  ArenaStringPtr *pAVar9;
  Nonnull<const_char_*> pcVar10;
  ulong uVar11;
  size_t sVar12;
  
  if (((field->containing_type_ == (Descriptor *)0x0) ||
      ((field->containing_type_->options_->field_0)._impl_.map_entry_ == false)) &&
     (bVar2 = FieldDescriptor::has_presence(field), bVar2)) {
LAB_00fa501f:
    IsSingularFieldNonEmpty();
LAB_00fa5027:
    IsSingularFieldNonEmpty();
LAB_00fa502f:
    IsSingularFieldNonEmpty();
LAB_00fa503a:
    IsSingularFieldNonEmpty();
  }
  bVar1 = field->field_0x1;
  bVar2 = (bool)((bVar1 & 0x20) >> 5);
  if (0xbf < bVar1 == bVar2) {
    pcVar10 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                        (bVar2,0xbf < bVar1,
                         "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar10 != (Nonnull<const_char_*>)0x0) goto LAB_00fa502f;
  if ((field->field_0x1 & 0x20) != 0) {
    IsSingularFieldNonEmpty();
switchD_00fa4eef_caseD_a:
    IsSingularFieldNonEmpty();
    goto LAB_00fa501f;
  }
  if ((field->type_ == '\v') && (bVar2 = FieldDescriptor::is_map_message_type(field), bVar2))
  goto LAB_00fa5027;
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
  case 1:
  case 8:
    pfVar4 = (float *)GetRaw<int>(this,message,field);
    break;
  case 2:
    pdVar6 = (double *)GetRaw<long>(this,message,field);
    goto LAB_00fa4f51;
  case 3:
    pfVar4 = (float *)GetRaw<unsigned_int>(this,message,field);
    break;
  case 4:
    pdVar6 = (double *)GetRaw<unsigned_long>(this,message,field);
    goto LAB_00fa4f51;
  case 5:
    pdVar6 = GetRaw<double>(this,message,field);
LAB_00fa4f51:
    bVar2 = *pdVar6 == 0.0;
    goto LAB_00fa4f68;
  case 6:
    pfVar4 = GetRaw<float>(this,message,field);
    break;
  case 7:
    pbVar5 = GetRaw<bool>(this,message,field);
    return *pbVar5;
  case 9:
    CVar3 = FieldDescriptor::cpp_string_type(field);
    if ((CVar3 != kView) && (CVar3 != kString)) {
      if (CVar3 != kCord) goto LAB_00fa503a;
      pCVar7 = GetRaw<absl::lts_20250127::Cord_const>(this,message,field);
      uVar11 = (ulong)(pCVar7->contents_).data_.rep_.field_0.data[0];
      if ((uVar11 & 1) == 0) {
        sVar12 = uVar11 >> 1;
      }
      else {
        sVar12 = ((pCVar7->contents_).data_.rep_.field_0.as_tree.rep)->length;
      }
      bVar2 = sVar12 == 0;
      goto LAB_00fa4f68;
    }
    goto LAB_00fa4fb1;
  case 10:
    goto switchD_00fa4eef_caseD_a;
  default:
    IsSingularFieldNonEmpty();
LAB_00fa4fb1:
    bVar2 = protobuf::internal::ReflectionSchema::IsFieldInlined(&this->schema_,field);
    if (bVar2) {
      pIVar8 = GetRaw<google::protobuf::internal::InlinedStringField>(this,message,field);
    }
    else {
      pAVar9 = GetRaw<google::protobuf::internal::ArenaStringPtr>(this,message,field);
      pIVar8 = (InlinedStringField *)((ulong)(pAVar9->tagged_ptr_).ptr_ & 0xfffffffffffffffc);
    }
    bVar2 = (pIVar8->field_0).str_._M_string_length == 0;
    goto LAB_00fa4f68;
  }
  bVar2 = *pfVar4 == 0.0;
LAB_00fa4f68:
  return !bVar2;
}

Assistant:

bool Reflection::IsSingularFieldNonEmpty(const Message& message,
                                         const FieldDescriptor* field) const {
  ABSL_DCHECK(IsMapEntry(field) || !field->has_presence());
  ABSL_DCHECK(!field->is_repeated());
  ABSL_DCHECK(!field->is_map());
  ABSL_DCHECK(field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE);
  // Scalar primitive (numeric or string/bytes) fields are present if
  // their value is non-zero (numeric) or non-empty (string/bytes). N.B.:
  // we must use this definition here, rather than the "scalar fields
  // always present" in the proto3 docs, because MergeFrom() semantics
  // require presence as "present on wire", and reflection-based merge
  // (which uses HasField()) needs to be consistent with this.
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_BOOL:
      return GetRaw<bool>(message, field) != false;
    case FieldDescriptor::CPPTYPE_INT32:
      return GetRaw<int32_t>(message, field) != 0;
    case FieldDescriptor::CPPTYPE_INT64:
      return GetRaw<int64_t>(message, field) != 0;
    case FieldDescriptor::CPPTYPE_UINT32:
      return GetRaw<uint32_t>(message, field) != 0;
    case FieldDescriptor::CPPTYPE_UINT64:
      return GetRaw<uint64_t>(message, field) != 0;
    case FieldDescriptor::CPPTYPE_FLOAT:
      static_assert(sizeof(uint32_t) == sizeof(float),
                    "Code assumes uint32_t and float are the same size.");
      return absl::bit_cast<uint32_t>(GetRaw<float>(message, field)) != 0;
    case FieldDescriptor::CPPTYPE_DOUBLE:
      static_assert(sizeof(uint64_t) == sizeof(double),
                    "Code assumes uint64_t and double are the same size.");
      return absl::bit_cast<uint64_t>(GetRaw<double>(message, field)) != 0;
    case FieldDescriptor::CPPTYPE_ENUM:
      return GetRaw<int>(message, field) != 0;
    case FieldDescriptor::CPPTYPE_STRING:
      switch (field->cpp_string_type()) {
        case FieldDescriptor::CppStringType::kCord:
          return !GetField<const absl::Cord>(message, field).empty();
        case FieldDescriptor::CppStringType::kView:
        case FieldDescriptor::CppStringType::kString: {
          if (IsInlined(field)) {
            return !GetField<InlinedStringField>(message, field)
                        .GetNoArena()
                        .empty();
          } else if (IsMicroString(field)) {
            return !GetField<MicroString>(message, field).Get().empty();
          }

          return !GetField<ArenaStringPtr>(message, field).Get().empty();
        }
        default:
          internal::Unreachable();
      }
    case FieldDescriptor::CPPTYPE_MESSAGE:
    default:
      internal::Unreachable();
  }
}